

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::MeanDamageRatioWithWeighting
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar)

{
  int *__k;
  pointer pmVar1;
  code *pcVar2;
  iterator iVar3;
  mapped_type *this_00;
  _Base_ptr p_Var4;
  undefined4 in_register_0000000c;
  long *plVar5;
  int in_stack_00000008;
  pair<const_outkey2,_OutLosses> x;
  lossval lv;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  unusedperiodstoweighting;
  map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  items;
  
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &items._M_t._M_impl.super__Rb_tree_header._M_header;
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       items._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::_Rb_tree(&unusedperiodstoweighting._M_t,&(this->periodstoweighting_)._M_t);
  pmVar1 = (this->out_loss_->
           super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  plVar5 = (long *)((long)&x.second.agg_out_loss + CONCAT44(in_register_0000000c,epcalc));
  __k = &x.first.period_no;
  for (p_Var4 = *(_Base_ptr *)((long)&(pmVar1->_M_t)._M_impl.super__Rb_tree_header + 0x10);
      p_Var4 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    x.second.max_out_loss = *(OASIS_FLOAT *)&p_Var4[1]._M_left;
    x.first.summary_id = p_Var4[1]._M_color;
    x.first.period_no = *(int *)&p_Var4[1].field_0x4;
    x.first.sidx = *(int *)&p_Var4[1]._M_parent;
    x.second.agg_out_loss = *(OASIS_FLOAT *)((long)&p_Var4[1]._M_parent + 4);
    pcVar2 = (code *)GetOutLoss;
    if ((GetOutLoss & 1) != 0) {
      pcVar2 = *(code **)(*plVar5 + -1 + GetOutLoss);
    }
    lv.value = (OASIS_FLOAT)(*pcVar2)(plVar5);
    iVar3 = std::
            _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
            ::find(&(this->periodstoweighting_)._M_t,__k);
    if ((_Rb_tree_header *)iVar3._M_node !=
        &(this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header) {
      lv.period_weighting = (double)iVar3._M_node[1]._M_parent;
      lv.period_no = x.first.period_no;
      this_00 = std::
                map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                ::operator[](&items,(key_type *)&x);
      std::vector<lossval,_std::allocator<lossval>_>::push_back(this_00,&lv);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::erase(&unusedperiodstoweighting._M_t,__k);
  }
  WriteExceedanceProbabilityTable
            (this,fileIDs,&items,(float)this->samplesize_,eptype,eptype_tvar,in_stack_00000008,
             &unusedperiodstoweighting,1);
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree(&unusedperiodstoweighting._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  ::~_Rb_tree(&items._M_t);
  return;
}

Assistant:

void aggreports::MeanDamageRatioWithWeighting(const std::vector<int> &fileIDs,
	OASIS_FLOAT (OutLosses::*GetOutLoss)(), const int epcalc,
	const int eptype, const int eptype_tvar) {

  std::map<int, lossvec2> items;
  std::map<int, double> unusedperiodstoweighting = periodstoweighting_;

  for (auto x : (*out_loss_)[MEANS]) {
    lossval lv;
    lv.value = (x.second.*GetOutLoss)();
    auto iter = periodstoweighting_.find(x.first.period_no);
    if (iter != periodstoweighting_.end()) {
      lv.period_weighting = iter->second;
      lv.period_no = x.first.period_no;   // for debugging
      items[x.first.summary_id].push_back(lv);
    }
    unusedperiodstoweighting.erase(x.first.period_no);
  }

  WriteExceedanceProbabilityTable(fileIDs, items, samplesize_, epcalc, eptype,
				  eptype_tvar, unusedperiodstoweighting);

}